

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void prelu(pBox *pbox,mydataFmt *pbias,mydataFmt *prelu_gmma)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  float local_4c;
  int local_48;
  int local_44;
  int col;
  int channel;
  long dis;
  mydataFmt *pg;
  mydataFmt *pb;
  mydataFmt *op;
  mydataFmt *prelu_gmma_local;
  mydataFmt *pbias_local;
  pBox *pbox_local;
  
  if (pbox->pdata == (mydataFmt *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"the  pRelu feature is NULL!!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (pbias == (mydataFmt *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"the  pRelu bias is NULL!!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    pb = pbox->pdata;
    iVar1 = pbox->width;
    iVar2 = pbox->height;
    dis = (long)prelu_gmma;
    pg = pbias;
    for (local_44 = 0; local_44 < pbox->channel; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < iVar1 * iVar2; local_48 = local_48 + 1) {
        *pb = *pb + *pg;
        if (*pb <= 0.0) {
          local_4c = *pb * *(float *)dis;
        }
        else {
          local_4c = *pb;
        }
        *pb = local_4c;
        pb = pb + 1;
      }
      pg = pg + 1;
      dis = dis + 4;
    }
  }
  return;
}

Assistant:

void prelu(struct pBox *pbox, mydataFmt *pbias, mydataFmt *prelu_gmma) {
    if (pbox->pdata == NULL) {
        cout << "the  pRelu feature is NULL!!" << endl;
        return;
    }
    if (pbias == NULL) {
        cout << "the  pRelu bias is NULL!!" << endl;
        return;
    }
    mydataFmt *op = pbox->pdata;
    mydataFmt *pb = pbias;
    mydataFmt *pg = prelu_gmma;

    long dis = pbox->width * pbox->height;
    for (int channel = 0; channel < pbox->channel; channel++) {
        for (int col = 0; col < dis; col++) {
            *op = *op + *pb;
            *op = (*op > 0) ? (*op) : ((*op) * (*pg));
            op++;
        }
        pb++;
        pg++;
    }
}